

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O1

CBlock * __thiscall
blockfilter_index_tests::BuildChainTestingSetup::CreateBlock
          (CBlock *__return_storage_ptr__,BuildChainTestingSetup *this,CBlockIndex *prev,
          vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns,
          CScript *scriptPubKey)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  uint32_t *puVar1;
  uint256 *puVar2;
  CBlockIndex *pCVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint256 hash;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  bool bVar14;
  Chainstate *chainstate;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  undefined8 uVar15;
  CBlockIndex *pCVar16;
  long lVar17;
  CBlockIndex *__args;
  CBlockTemplate *pCVar18;
  CBlock *pCVar19;
  long in_FS_OFFSET;
  byte bVar20;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  CMutableTransaction tx_coinbase;
  Options options;
  undefined1 local_180 [16];
  undefined1 local_170 [40];
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_148 [2];
  Options local_a8;
  uint256 local_78;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_38;
  
  bVar20 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.super_BlockCreateOptions.use_mempool = true;
  local_a8.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  local_a8.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  local_a8.nBlockMaxWeight = 0x3cf960;
  local_a8.blockMinFeeRate.nSatoshisPerK = 1000;
  local_a8.test_block_validity = true;
  local_a8.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup
                          .super_BasicTestingSetup.m_node.chainman._M_t.
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)local_170,chainstate,
             (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&local_a8);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_180,(CScript *)local_170);
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_148);
  if ((CBlockTemplate *)local_170._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_170,(CBlockTemplate *)local_170._0_8_);
  }
  uVar15 = local_180._0_8_;
  puVar2 = prev->phashBlock;
  if (puVar2 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  uVar8 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
  uVar9 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
  uVar5 = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x14);
  uVar6 = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
  uVar7 = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x1c);
  *(undefined4 *)
   ((((CBlock *)local_180._0_8_)->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined4 *)
   ((((CBlock *)local_180._0_8_)->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
    _M_elems + 0x14) = uVar5;
  *(undefined4 *)
   ((((CBlock *)local_180._0_8_)->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar6;
  *(undefined4 *)
   ((((CBlock *)local_180._0_8_)->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
    _M_elems + 0x1c) = uVar7;
  *(undefined8 *)
   (((CBlock *)local_180._0_8_)->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
   _M_elems = uVar8;
  *(undefined8 *)
   ((((CBlock *)local_180._0_8_)->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar9;
  (((CBlock *)local_180._0_8_)->super_CBlockHeader).nTime = prev->nTime + 1;
  this_00 = &((CBlock *)local_180._0_8_)->vtx;
  pCVar16 = prev;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(this_00,1);
  __args = (CBlockIndex *)
           (txns->super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (CBlockIndex *)
           (txns->super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != pCVar3) {
    do {
      local_170._0_8_ =
           (_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)0x0
      ;
      pCVar16 = __args;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8),
                 (CTransaction **)local_170,(allocator<CTransaction> *)local_58,
                 (CMutableTransaction *)__args);
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)this_00,(shared_ptr<const_CTransaction> *)local_170);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
      }
      __args = (CBlockIndex *)((__args->nChainWork).super_base_uint<256U>.pn + 4);
    } while (__args != pCVar3);
  }
  psVar4 = (((CBlock *)uVar15)->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((((CBlock *)uVar15)->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_002e2398;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_002e224d:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_002e2398;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               ((long)pCVar16 >> 3) * 0x4ec4ec4ec4ec4ec5);
  }
  else {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)local_170,
               (psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    local_58._16_8_ = 0;
    uStack_40 = 0;
    local_58._0_8_ = (element_type *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    other = &CScript::push_int64((CScript *)local_58,(long)prev->nHeight + 1)->super_CScriptBase;
    pCVar16 = (CBlockIndex *)(local_170._8_8_ - local_170._0_8_);
    if (pCVar16 == (CBlockIndex *)0x0) goto LAB_002e224d;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_170._0_8_ + 0x28),other);
    if (0x1c < uStack_40._4_4_) {
      free((void *)local_58._0_8_);
    }
    local_58._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
               (CTransaction **)local_58,(allocator<CTransaction> *)(local_180 + 0xf),
               (CMutableTransaction *)local_170);
    uVar9 = local_58._8_8_;
    uVar8 = local_58._0_8_;
    psVar4 = (((CBlock *)uVar15)->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((CBlock *)uVar15)->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
      local_58._0_8_ = (element_type *)0x0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar8;
      (psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      BlockMerkleRoot((uint256 *)local_58,(CBlock *)uVar15,(bool *)0x0);
      *(undefined8 *)
       ((((CBlock *)uVar15)->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = local_58._16_8_;
      *(undefined8 *)
       ((((CBlock *)uVar15)->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uStack_40;
      *(undefined8 *)
       (((CBlock *)uVar15)->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
           = local_58._0_8_;
      *(undefined8 *)
       ((((CBlock *)uVar15)->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
        _M_elems + 8) = local_58._8_8_;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_170 + 0x18));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_170);
      while( true ) {
        CBlockHeader::GetHash(&local_78,(CBlockHeader *)uVar15);
        hash.super_base_blob<256U>.m_data._M_elems[8] =
             local_78.super_base_blob<256U>.m_data._M_elems[8];
        hash.super_base_blob<256U>.m_data._M_elems[9] =
             local_78.super_base_blob<256U>.m_data._M_elems[9];
        hash.super_base_blob<256U>.m_data._M_elems[10] =
             local_78.super_base_blob<256U>.m_data._M_elems[10];
        hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xb];
        hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xc];
        hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xd];
        hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xe];
        hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xf];
        hash.super_base_blob<256U>.m_data._M_elems[0] =
             local_78.super_base_blob<256U>.m_data._M_elems[0];
        hash.super_base_blob<256U>.m_data._M_elems[1] =
             local_78.super_base_blob<256U>.m_data._M_elems[1];
        hash.super_base_blob<256U>.m_data._M_elems[2] =
             local_78.super_base_blob<256U>.m_data._M_elems[2];
        hash.super_base_blob<256U>.m_data._M_elems[3] =
             local_78.super_base_blob<256U>.m_data._M_elems[3];
        hash.super_base_blob<256U>.m_data._M_elems[4] =
             local_78.super_base_blob<256U>.m_data._M_elems[4];
        hash.super_base_blob<256U>.m_data._M_elems[5] =
             local_78.super_base_blob<256U>.m_data._M_elems[5];
        hash.super_base_blob<256U>.m_data._M_elems[6] =
             local_78.super_base_blob<256U>.m_data._M_elems[6];
        hash.super_base_blob<256U>.m_data._M_elems[7] =
             local_78.super_base_blob<256U>.m_data._M_elems[7];
        hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x10];
        hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x11];
        hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x12];
        hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x13];
        hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x14];
        hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x15];
        hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x16];
        hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x17];
        hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x18];
        hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x19];
        hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1a];
        hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1b];
        hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1c];
        hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1d];
        hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1e];
        hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1f];
        bVar14 = CheckProofOfWork(hash,(((CBlock *)uVar15)->super_CBlockHeader).nBits,
                                  &((((this->super_TestChain100Setup).super_TestingSetup.
                                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                                      chainman._M_t.
                                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                      .super__Head_base<0UL,_ChainstateManager_*,_false>.
                                     _M_head_impl)->m_options).chainparams)->consensus);
        if (bVar14) break;
        puVar1 = &(((CBlock *)uVar15)->super_CBlockHeader).nNonce;
        *puVar1 = *puVar1 + 1;
      }
      pCVar18 = (CBlockTemplate *)uVar15;
      pCVar19 = __return_storage_ptr__;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        uVar10 = (pCVar18->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                 _M_elems[0];
        uVar11 = (pCVar18->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                 _M_elems[1];
        uVar12 = (pCVar18->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                 _M_elems[2];
        uVar13 = (pCVar18->block).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                 _M_elems[3];
        (pCVar19->super_CBlockHeader).nVersion = (pCVar18->block).super_CBlockHeader.nVersion;
        (pCVar19->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
             uVar10;
        (pCVar19->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
             uVar11;
        (pCVar19->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
             uVar12;
        (pCVar19->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
             uVar13;
        pCVar18 = (CBlockTemplate *)((long)pCVar18 + (ulong)bVar20 * -0x10 + 8);
        pCVar19 = (CBlock *)((long)pCVar19 + (ulong)bVar20 * -0x10 + 8);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::vector(&__return_storage_ptr__->vtx,this_00);
      __return_storage_ptr__->m_checked_merkle_root = ((CBlock *)uVar15)->m_checked_merkle_root;
      bVar14 = ((CBlock *)uVar15)->m_checked_witness_commitment;
      __return_storage_ptr__->fChecked = ((CBlock *)uVar15)->fChecked;
      __return_storage_ptr__->m_checked_witness_commitment = bVar14;
      if ((CBlockTemplate *)local_180._0_8_ != (CBlockTemplate *)0x0) {
        std::default_delete<node::CBlockTemplate>::operator()
                  ((default_delete<node::CBlockTemplate> *)local_180,
                   (CBlockTemplate *)local_180._0_8_);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_002e2398;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar15 = std::__throw_out_of_range_fmt
                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                        0,0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_170 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_170);
    if ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)local_180._0_8_
        != (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0) {
      std::default_delete<node::CBlockTemplate>::operator()
                ((default_delete<node::CBlockTemplate> *)local_180,(CBlockTemplate *)local_180._0_8_
                );
    }
    local_180._0_8_ = (CBlockTemplate *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar15);
    }
  }
LAB_002e2398:
  __stack_chk_fail();
}

Assistant:

CBlock BuildChainTestingSetup::CreateBlock(const CBlockIndex* prev,
    const std::vector<CMutableTransaction>& txns,
    const CScript& scriptPubKey)
{
     BlockAssembler::Options options;
    std::unique_ptr<CBlockTemplate> pblocktemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(scriptPubKey);
    CBlock& block = pblocktemplate->block;
    block.hashPrevBlock = prev->GetBlockHash();
    block.nTime = prev->nTime + 1;

    // Replace mempool-selected txns with just coinbase plus passed-in txns:
    block.vtx.resize(1);
    for (const CMutableTransaction& tx : txns) {
        block.vtx.push_back(MakeTransactionRef(tx));
    }
    {
        CMutableTransaction tx_coinbase{*block.vtx.at(0)};
        tx_coinbase.vin.at(0).scriptSig = CScript{} << prev->nHeight + 1;
        block.vtx.at(0) = MakeTransactionRef(std::move(tx_coinbase));
        block.hashMerkleRoot = BlockMerkleRoot(block);
    }

    while (!CheckProofOfWork(block.GetHash(), block.nBits, m_node.chainman->GetConsensus())) ++block.nNonce;

    return block;
}